

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O1

void __thiscall Assimp::ScenePreprocessor::ProcessMesh(ScenePreprocessor *this,aiMesh *mesh)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  aiVector3D *paVar7;
  Logger *this_00;
  aiVector3D *paVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint i;
  long lVar14;
  bool bVar15;
  
  lVar14 = 0;
  do {
    if (mesh->mTextureCoords[lVar14] == (aiVector3D *)0x0) {
      mesh->mNumUVComponents[lVar14] = 0;
    }
    else {
      if (mesh->mNumUVComponents[lVar14] == 0) {
        mesh->mNumUVComponents[lVar14] = 2;
      }
      paVar8 = mesh->mTextureCoords[lVar14];
      uVar9 = (ulong)mesh->mNumVertices;
      uVar10 = mesh->mNumUVComponents[lVar14];
      if (uVar10 == 1) {
        if (uVar9 != 0) {
          lVar11 = 0;
          do {
            *(undefined8 *)((long)&paVar8->y + lVar11) = 0;
            lVar11 = lVar11 + 0xc;
          } while (uVar9 * 0xc != lVar11);
        }
      }
      else if (uVar10 == 2) {
        if (uVar9 != 0) {
          lVar11 = 0;
          do {
            *(undefined4 *)((long)&paVar8->z + lVar11) = 0;
            lVar11 = lVar11 + 0xc;
          } while (uVar9 * 0xc != lVar11);
        }
      }
      else if (uVar10 == 3) {
        bVar15 = uVar9 == 0;
        if (!bVar15) {
          if ((paVar8->z == 0.0) && (!NAN(paVar8->z))) {
            lVar11 = 0;
            do {
              bVar15 = uVar9 * 0xc + -0xc == lVar11;
              if (bVar15) goto LAB_003a31c6;
              fVar1 = *(float *)((long)&paVar8[1].z + lVar11);
              lVar11 = lVar11 + 0xc;
            } while ((fVar1 == 0.0) && (!NAN(fVar1)));
          }
          if (!bVar15) goto LAB_003a3238;
        }
LAB_003a31c6:
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,
                     "ScenePreprocessor: UVs are declared to be 3D but they\'re obviously not. Reverting to 2D."
                    );
        mesh->mNumUVComponents[lVar14] = 2;
      }
    }
LAB_003a3238:
    lVar14 = lVar14 + 1;
    if (lVar14 == 8) {
      if ((mesh->mPrimitiveTypes == 0) && ((ulong)mesh->mNumFaces != 0)) {
        uVar10 = mesh->mPrimitiveTypes;
        lVar14 = 0;
        do {
          uVar13 = *(int *)((long)&mesh->mFaces->mNumIndices + lVar14) - 1;
          uVar12 = 8;
          if (uVar13 < 3) {
            uVar12 = *(uint *)(&DAT_0071e1f4 + (ulong)uVar13 * 4);
          }
          uVar10 = uVar10 | uVar12;
          mesh->mPrimitiveTypes = uVar10;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)mesh->mNumFaces << 4 != lVar14);
      }
      if (((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mNormals != (aiVector3D *)0x0)) &&
         (mesh->mBitangents == (aiVector3D *)0x0)) {
        uVar10 = mesh->mNumVertices;
        paVar8 = (aiVector3D *)operator_new__((ulong)uVar10 * 0xc);
        if (uVar10 != 0) {
          memset(paVar8,0,(((ulong)uVar10 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        mesh->mBitangents = paVar8;
        if (mesh->mNumVertices != 0) {
          lVar14 = 8;
          uVar9 = 0;
          do {
            paVar8 = mesh->mNormals;
            paVar7 = mesh->mTangents;
            fVar1 = *(float *)((long)paVar8 + lVar14 + -8);
            fVar2 = *(float *)((long)paVar8 + lVar14 + -4);
            fVar3 = *(float *)((long)&paVar7->x + lVar14);
            fVar4 = *(float *)((long)&paVar8->x + lVar14);
            fVar5 = *(float *)((long)paVar7 + lVar14 + -8);
            fVar6 = *(float *)((long)paVar7 + lVar14 + -4);
            paVar8 = mesh->mBitangents;
            *(ulong *)((long)paVar8 + lVar14 + -8) =
                 CONCAT44(fVar4 * fVar5 - fVar3 * fVar1,fVar2 * fVar3 - fVar6 * fVar4);
            *(float *)((long)&paVar8->x + lVar14) = fVar1 * fVar6 - fVar5 * fVar2;
            uVar9 = uVar9 + 1;
            lVar14 = lVar14 + 0xc;
          } while (uVar9 < mesh->mNumVertices);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void ScenePreprocessor::ProcessMesh (aiMesh* mesh)
{
    // If aiMesh::mNumUVComponents is *not* set assign the default value of 2
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i)   {
        if (!mesh->mTextureCoords[i]) {
            mesh->mNumUVComponents[i] = 0;
        } else {
            if (!mesh->mNumUVComponents[i])
                mesh->mNumUVComponents[i] = 2;

            aiVector3D* p = mesh->mTextureCoords[i], *end = p+mesh->mNumVertices;

            // Ensure unused components are zeroed. This will make 1D texture channels work
            // as if they were 2D channels .. just in case an application doesn't handle
            // this case
            if (2 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = 0.f;
            }
            else if (1 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = p->y = 0.f;
            }
            else if (3 == mesh->mNumUVComponents[i]) {
                // Really 3D coordinates? Check whether the third coordinate is != 0 for at least one element
                for (; p != end; ++p) {
                    if (p->z != 0)
                        break;
                }
                if (p == end) {
                    ASSIMP_LOG_WARN("ScenePreprocessor: UVs are declared to be 3D but they're obviously not. Reverting to 2D.");
                    mesh->mNumUVComponents[i] = 2;
                }
            }
        }
    }

    // If the information which primitive types are there in the
    // mesh is currently not available, compute it.
    if (!mesh->mPrimitiveTypes) {
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)  {
            aiFace& face = mesh->mFaces[a];
            switch (face.mNumIndices)
            {
            case 3u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                break;

            case 2u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                break;

            case 1u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                break;

            default:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                break;
            }
        }
    }

    // If tangents and normals are given but no bitangents compute them
    if (mesh->mTangents && mesh->mNormals && !mesh->mBitangents)    {

        mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
        for (unsigned int i = 0; i < mesh->mNumVertices;++i)    {
            mesh->mBitangents[i] = mesh->mNormals[i] ^ mesh->mTangents[i];
        }
    }
}